

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

QString * __thiscall
QString::replace(QString *this,QString *before,QString *after,CaseSensitivity cs)

{
  char16_t *before_00;
  QString *pQVar1;
  char16_t *after_00;
  
  before_00 = (before->d).ptr;
  if ((QChar *)before_00 == (QChar *)0x0) {
    before_00 = L"";
  }
  after_00 = (after->d).ptr;
  if ((QChar *)after_00 == (QChar *)0x0) {
    after_00 = L"";
  }
  pQVar1 = replace(this,(QChar *)before_00,(before->d).size,(QChar *)after_00,(after->d).size,cs);
  return pQVar1;
}

Assistant:

QString &QString::replace(const QString &before, const QString &after, Qt::CaseSensitivity cs)
{
    return replace(before.constData(), before.size(), after.constData(), after.size(), cs);
}